

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateMoveResult(void)

{
  float fVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  float local_60;
  ImVec2 local_58;
  ImVec2 local_44;
  ImVec2 local_3c;
  undefined1 local_34 [8];
  ImRect rect_abs;
  float scroll_target;
  ImVec2 delta_scroll;
  ImGuiNavMoveResult *result;
  ImGuiContext *g;
  
  pIVar2 = GImGui;
  if (((GImGui->NavMoveResultLocal).ID == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
    if (GImGui->NavId == 0) {
      return;
    }
    GImGui->NavDisableHighlight = false;
    pIVar2->NavDisableMouseHover = true;
    return;
  }
  if ((GImGui->NavMoveResultLocal).ID == 0) {
    local_58 = (ImVec2)&GImGui->NavMoveResultOther;
  }
  else {
    local_58 = (ImVec2)&GImGui->NavMoveResultLocal;
  }
  delta_scroll = local_58;
  if ((((GImGui->NavMoveRequestFlags & 0x20U) != 0) &&
      ((GImGui->NavMoveResultLocalVisibleSet).ID != 0)) &&
     ((GImGui->NavMoveResultLocalVisibleSet).ID != GImGui->NavId)) {
    delta_scroll = (ImVec2)&GImGui->NavMoveResultLocalVisibleSet;
  }
  if (((delta_scroll != (ImVec2)&GImGui->NavMoveResultOther) &&
      ((GImGui->NavMoveResultOther).ID != 0)) &&
     (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
    if (*(float *)((long)delta_scroll + 0x10) <= (GImGui->NavMoveResultOther).DistBox) {
      fVar1 = (GImGui->NavMoveResultOther).DistBox;
      if (((fVar1 != *(float *)((long)delta_scroll + 0x10)) ||
          (NAN(fVar1) || NAN(*(float *)((long)delta_scroll + 0x10)))) ||
         (*(float *)((long)delta_scroll + 0x14) <= (GImGui->NavMoveResultOther).DistCenter))
      goto LAB_001ce4ad;
    }
    delta_scroll = (ImVec2)&GImGui->NavMoveResultOther;
  }
LAB_001ce4ad:
  bVar3 = false;
  if (GImGui->NavWindow != (ImGuiWindow *)0x0) {
    bVar3 = *(long *)delta_scroll != 0;
  }
  if (bVar3) {
    if (GImGui->NavLayer == ImGuiNavLayer_Main) {
      ImVec2::ImVec2((ImVec2 *)&rect_abs.Max.y);
      if ((pIVar2->NavMoveRequestFlags & 0x40U) == 0) {
        local_3c = operator+((ImVec2 *)((long)delta_scroll + 0x1c),
                             (ImVec2 *)(*(long *)delta_scroll + 0x10));
        local_44 = operator+((ImVec2 *)((long)delta_scroll + 0x24),
                             (ImVec2 *)(*(long *)delta_scroll + 0x10));
        ImRect::ImRect((ImRect *)local_34,&local_3c,&local_44);
        register0x00001200 =
             ScrollToBringRectIntoView(*(ImGuiWindow **)delta_scroll,(ImRect *)local_34);
      }
      else {
        if (pIVar2->NavMoveDir == 2) {
          local_60 = *(float *)(*(long *)delta_scroll + 0x68);
        }
        else {
          local_60 = 0.0;
        }
        rect_abs.Max.x = local_60;
        scroll_target = *(float *)(*(long *)delta_scroll + 0x60) - local_60;
        SetScrollY(*(ImGuiWindow **)delta_scroll,local_60);
      }
      ImRect::TranslateX((ImRect *)((long)delta_scroll + 0x1c),-rect_abs.Max.y);
      ImRect::TranslateY((ImRect *)((long)delta_scroll + 0x1c),-scroll_target);
    }
    ClearActiveID();
    pIVar2->NavWindow = *(ImGuiWindow **)delta_scroll;
    if (pIVar2->NavId != *(ImGuiID *)((long)delta_scroll + 8)) {
      pIVar2->NavJustMovedToId = *(ImGuiID *)((long)delta_scroll + 8);
      pIVar2->NavJustMovedToFocusScopeId = *(ImGuiID *)((long)delta_scroll + 0xc);
      pIVar2->NavJustMovedToKeyMods = pIVar2->NavMoveRequestKeyMods;
    }
    SetNavIDWithRectRel(*(ImGuiID *)((long)delta_scroll + 8),pIVar2->NavLayer,
                        *(ImGuiID *)((long)delta_scroll + 0xc),(ImRect *)((long)delta_scroll + 0x1c)
                       );
    return;
  }
  __assert_fail("g.NavWindow && result->Window",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aaronaanderson[P]pedal_live/external/imgui/imgui.cpp"
                ,0x2399,"void ImGui::NavUpdateMoveResult()");
}

Assistant:

static void ImGui::NavUpdateMoveResult()
{
    ImGuiContext& g = *GImGui;
    if (g.NavMoveResultLocal.ID == 0 && g.NavMoveResultOther.ID == 0)
    {
        // In a situation when there is no results but NavId != 0, re-enable the Navigation highlight (because g.NavId is not considered as a possible result)
        if (g.NavId != 0)
        {
            g.NavDisableHighlight = false;
            g.NavDisableMouseHover = true;
        }
        return;
    }

    // Select which result to use
    ImGuiNavMoveResult* result = (g.NavMoveResultLocal.ID != 0) ? &g.NavMoveResultLocal : &g.NavMoveResultOther;

    // PageUp/PageDown behavior first jumps to the bottom/top mostly visible item, _otherwise_ use the result from the previous/next page.
    if (g.NavMoveRequestFlags & ImGuiNavMoveFlags_AlsoScoreVisibleSet)
        if (g.NavMoveResultLocalVisibleSet.ID != 0 && g.NavMoveResultLocalVisibleSet.ID != g.NavId)
            result = &g.NavMoveResultLocalVisibleSet;

    // Maybe entering a flattened child from the outside? In this case solve the tie using the regular scoring rules.
    if (result != &g.NavMoveResultOther && g.NavMoveResultOther.ID != 0 && g.NavMoveResultOther.Window->ParentWindow == g.NavWindow)
        if ((g.NavMoveResultOther.DistBox < result->DistBox) || (g.NavMoveResultOther.DistBox == result->DistBox && g.NavMoveResultOther.DistCenter < result->DistCenter))
            result = &g.NavMoveResultOther;
    IM_ASSERT(g.NavWindow && result->Window);

    // Scroll to keep newly navigated item fully into view.
    if (g.NavLayer == ImGuiNavLayer_Main)
    {
        ImVec2 delta_scroll;
        if (g.NavMoveRequestFlags & ImGuiNavMoveFlags_ScrollToEdge)
        {
            float scroll_target = (g.NavMoveDir == ImGuiDir_Up) ? result->Window->ScrollMax.y : 0.0f;
            delta_scroll.y = result->Window->Scroll.y - scroll_target;
            SetScrollY(result->Window, scroll_target);
        }
        else
        {
            ImRect rect_abs = ImRect(result->RectRel.Min + result->Window->Pos, result->RectRel.Max + result->Window->Pos);
            delta_scroll = ScrollToBringRectIntoView(result->Window, rect_abs);
        }

        // Offset our result position so mouse position can be applied immediately after in NavUpdate()
        result->RectRel.TranslateX(-delta_scroll.x);
        result->RectRel.TranslateY(-delta_scroll.y);
    }

    ClearActiveID();
    g.NavWindow = result->Window;
    if (g.NavId != result->ID)
    {
        // Don't set NavJustMovedToId if just landed on the same spot (which may happen with ImGuiNavMoveFlags_AllowCurrentNavId)
        g.NavJustMovedToId = result->ID;
        g.NavJustMovedToFocusScopeId = result->FocusScopeId;
        g.NavJustMovedToKeyMods = g.NavMoveRequestKeyMods;
    }
    IMGUI_DEBUG_LOG_NAV("[nav] NavMoveRequest: result NavID 0x%08X in Layer %d Window \"%s\"\n", result->ID, g.NavLayer, g.NavWindow->Name);
    SetNavIDWithRectRel(result->ID, g.NavLayer, result->FocusScopeId, result->RectRel);
}